

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::truncSatZeroUToI32x4(Literal *__return_storage_ptr__,Literal *this)

{
  Literal *this_local;
  
  unary_zero<4,_&wasm::Literal::getLanesF64x2,_&wasm::Literal::truncSatToUI32>
            (__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::truncSatZeroUToI32x4() const {
  return unary_zero<4, &Literal::getLanesF64x2, &Literal::truncSatToUI32>(
    *this);
}